

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall MemoryReader::Seek(MemoryReader *this,long offset,int origin)

{
  long lVar1;
  long lStack_18;
  int origin_local;
  long offset_local;
  MemoryReader *this_local;
  
  if (origin == 1) {
    lStack_18 = (this->super_FileReader).FilePos + offset;
  }
  else {
    lStack_18 = offset;
    if (origin == 2) {
      lStack_18 = (this->super_FileReader).Length + offset;
    }
  }
  lVar1 = clamp<long>(lStack_18,0,(this->super_FileReader).Length);
  (this->super_FileReader).FilePos = lVar1;
  return 0;
}

Assistant:

long MemoryReader::Seek (long offset, int origin)
{
	switch (origin)
	{
	case SEEK_CUR:
		offset+=FilePos;
		break;

	case SEEK_END:
		offset+=Length;
		break;

	}
	FilePos=clamp<long>(offset,0,Length);
	return 0;
}